

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall Math_ErfInv_Test::TestBody(Math_ErfInv_Test *this)

{
  char *pcVar1;
  long lVar2;
  undefined1 auVar3 [16];
  float a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  float local_58;
  Float ei;
  AssertionResult gtest_ar;
  Float err;
  AssertHelper local_38;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x18) {
      return;
    }
    local_58 = *(float *)((long)&DAT_00583180 + lVar2);
    a = erff(local_58);
    if (a < 1.0) {
      ei = pbrt::ErfInv(a);
      if ((local_58 != 0.0) || (NAN(local_58))) {
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar3 = vandps_avx512vl(ZEXT416((uint)(ei - local_58)),auVar3);
        local_60.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             0x3f1a36e2eb1c432d;
        err = auVar3._0_4_ / local_58;
        testing::internal::CmpHelperLT<float,double>
                  ((internal *)&gtest_ar,"err","1e-4",&err,(double *)&local_60);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_60);
          std::ostream::operator<<(local_60.ptr_ + 0x10,local_58);
          std::operator<<((ostream *)(local_60.ptr_ + 0x10)," erf ");
          std::ostream::operator<<(local_60.ptr_ + 0x10,a);
          std::operator<<((ostream *)(local_60.ptr_ + 0x10)," inv ");
          std::ostream::operator<<(local_60.ptr_ + 0x10,ei);
          pcVar1 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                     ,0xfa,pcVar1);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
          goto LAB_003565e9;
        }
      }
      else {
        local_60.ptr_ = local_60.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,float>
                  ((internal *)&gtest_ar,"0","ei",(int *)&local_60,&ei);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_60);
          pcVar1 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                     ,0xf7,pcVar1);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
LAB_003565e9:
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_60);
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

TEST(Math, ErfInv) {
    float xvl[] = {0., 0.1125, 0.25, .753, 1.521, 2.5115};
    for (float x : xvl) {
        Float e = std::erf(x);
        if (e < 1) {
            Float ei = ErfInv(e);
            if (x == 0)
                EXPECT_EQ(0, ei);
            else {
                Float err = std::abs(ei - x) / x;
                EXPECT_LT(err, 1e-4) << x << " erf " << e << " inv " << ei;
            }
        }
    }
}